

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O1

int fwrite_xattr(CURL *curl,char *url,int fd)

{
  char *__value;
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *value;
  char *local_40;
  char *local_38;
  
  local_38 = url;
  iVar1 = fsetxattr(fd,"user.creator","curl",4,0);
  if (iVar1 == 0) {
    lVar4 = 8;
    do {
      if (lVar4 + 0x10 == 0x38) {
        lVar4 = curl_url();
        if ((((lVar4 == 0) || (iVar1 = curl_url_set(lVar4,0,local_38,0x200), iVar1 != 0)) ||
            (iVar1 = curl_url_set(lVar4,2,0,0), iVar1 != 0)) ||
           ((iVar1 = curl_url_set(lVar4,3,0,0), iVar1 != 0 ||
            (iVar1 = curl_url_get(lVar4,0,&local_40,0), iVar1 != 0)))) {
          curl_url_cleanup(lVar4);
          pcVar5 = (char *)0x0;
        }
        else {
          curl_url_cleanup(lVar4);
          pcVar5 = local_40;
        }
        if (pcVar5 != (char *)0x0) {
          sVar3 = strlen(pcVar5);
          iVar1 = fsetxattr(fd,"user.xdg.origin.url",pcVar5,sVar3,0);
          curl_free(pcVar5);
          return iVar1;
        }
        return 1;
      }
      pcVar5 = *(char **)((long)&http_version[5].num + lVar4);
      local_40 = (char *)0x0;
      iVar1 = 0;
      iVar2 = curl_easy_getinfo(curl,*(undefined4 *)((long)&mappings[0].attr + lVar4),&local_40);
      __value = local_40;
      if (local_40 != (char *)0x0 && iVar2 == 0) {
        sVar3 = strlen(local_40);
        iVar1 = fsetxattr(fd,pcVar5,__value,sVar3,0);
      }
      lVar4 = lVar4 + 0x10;
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

int fwrite_xattr(CURL *curl, const char *url, int fd)
{
  int i = 0;
  int err = xattr(fd, "user.creator", "curl");

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(!err && mappings[i].attr) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value)
      err = xattr(fd, mappings[i].attr, value);
    i++;
  }
  if(!err) {
    char *nurl = stripcredentials(url);
    if(!nurl)
      return 1;
    err = xattr(fd, "user.xdg.origin.url", nurl);
    curl_free(nurl);
  }
  return err;
}